

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImg<char>::CImg(CImg<char> *this,CImg<char> *img)

{
  unsigned_long __n;
  char *pcVar1;
  unsigned_long siz;
  CImg<char> *img_local;
  CImg<char> *this_local;
  
  __n = size(img);
  if ((img->_data == (char *)0x0) || (__n == 0)) {
    this->_spectrum = 0;
    this->_depth = 0;
    this->_height = 0;
    this->_width = 0;
    this->_is_shared = false;
    this->_data = (char *)0x0;
  }
  else {
    this->_width = img->_width;
    this->_height = img->_height;
    this->_depth = img->_depth;
    this->_spectrum = img->_spectrum;
    this->_is_shared = (bool)(img->_is_shared & 1);
    if ((this->_is_shared & 1U) == 0) {
      pcVar1 = (char *)operator_new__(__n);
      this->_data = pcVar1;
      memcpy(this->_data,img->_data,__n);
    }
    else {
      this->_data = img->_data;
    }
  }
  return;
}

Assistant:

CImg(const CImg<T>& img) {
      const unsigned long siz = img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        _is_shared = img._is_shared;
        if (_is_shared) _data = const_cast<T*>(img._data);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*img._width*img._height*img._depth*img._spectrum),
                                        img._width,img._height,img._depth,img._spectrum);

          }
          std::memcpy(_data,img._data,siz*sizeof(T));
        }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }